

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

mat4 * mat4_look_at(mat4 *__return_storage_ptr__,vec3 position,vec3 target,vec3 up)

{
  mat4 m1;
  mat4 m2;
  vec3 vVar1;
  vec3 vVar2;
  vec3 vVar3;
  mat4 *pmVar4;
  undefined1 auStack_268 [8];
  mat4 T;
  mat4 M;
  float local_188;
  float fStack_184;
  vec3 u;
  float local_118;
  float fStack_114;
  vec3 s;
  float local_a8;
  float fStack_a4;
  vec3 f;
  vec3 up_p;
  vec3 up_local;
  vec3 target_local;
  vec3 position_local;
  
  pmVar4 = __return_storage_ptr__;
  vVar1 = vec3_normalize(up);
  vVar2 = vec3_subtract(target,position);
  vVar2 = vec3_normalize(vVar2);
  vVar1 = vec3_cross(vVar2,vVar1);
  vVar1 = vec3_normalize(vVar1);
  vVar3 = vec3_cross(vVar1,vVar2);
  vVar3 = vec3_normalize(vVar3);
  local_118 = vVar1.x;
  fStack_114 = vVar1.y;
  local_188 = vVar3.x;
  fStack_184 = vVar3.y;
  local_a8 = vVar2.x;
  fStack_a4 = vVar2.y;
  mat4_create((mat4 *)(T.m + 0xe),local_118,fStack_114,vVar1.z,0.0,local_188,fStack_184,vVar3.z,0.0,
              -local_a8,-fStack_a4,-vVar2.z,0.0,0.0,0.0,0.0,1.0);
  vVar1 = vec3_scale(position,-1.0);
  mat4_translation((mat4 *)auStack_268,vVar1);
  m1.m[2] = M.m[2];
  m1.m._0_8_ = M.m._0_8_;
  m1.m[3] = M.m[3];
  m1.m[4] = M.m[4];
  m1.m[5] = M.m[5];
  m1.m[6] = M.m[6];
  m1.m[7] = M.m[7];
  m1.m[8] = M.m[8];
  m1.m[9] = M.m[9];
  m1.m[10] = M.m[10];
  m1.m[0xb] = M.m[0xb];
  m1.m[0xc] = M.m[0xc];
  m1.m[0xd] = M.m[0xd];
  m1.m[0xe] = (float)auStack_268._0_4_;
  m1.m[0xf] = (float)auStack_268._4_4_;
  m2.m[2] = T.m[2];
  m2.m[3] = T.m[3];
  m2.m[0] = T.m[0];
  m2.m[1] = T.m[1];
  m2.m[4] = T.m[4];
  m2.m[5] = T.m[5];
  m2.m[6] = T.m[6];
  m2.m[7] = T.m[7];
  m2.m[8] = T.m[8];
  m2.m[9] = T.m[9];
  m2.m[10] = T.m[10];
  m2.m[0xb] = T.m[0xb];
  m2.m[0xc] = T.m[0xc];
  m2.m[0xd] = T.m[0xd];
  m2.m._56_8_ = pmVar4;
  mat4_multiply(m1,m2);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_look_at(vec3 position, vec3 target, vec3 up) {
    vec3 up_p = vec3_normalize(up);
    vec3 f = vec3_normalize(vec3_subtract(target, position));
    vec3 s = vec3_normalize(vec3_cross(f, up_p));
    vec3 u = vec3_normalize(vec3_cross(s, f));

    mat4 M = mat4_create(
            s.x, s.y, s.z, 0.0,
            u.x, u.y, u.z, 0.0,
            -f.x, -f.y, -f.z, 0.0,
            0.0, 0.0, 0.0, 1.0);
    mat4 T = mat4_translation(vec3_scale(position, -1.0));

    return mat4_multiply(M, T);
}